

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

Dict * NewDict(TidyDocImpl *doc,ctmbstr name)

{
  Dict *pDVar1;
  tmbstr local_28;
  Dict *np;
  ctmbstr name_local;
  TidyDocImpl *doc_local;
  
  pDVar1 = (Dict *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x40);
  pDVar1->id = TidyTag_UNKNOWN;
  if (name == (ctmbstr)0x0) {
    local_28 = (tmbstr)0x0;
  }
  else {
    local_28 = prvTidytmbstrdup(doc->allocator,name);
  }
  pDVar1->name = local_28;
  pDVar1->versions = 0;
  pDVar1->attrvers = (AttrVersion *)0x0;
  pDVar1->model = 0;
  pDVar1->parser = (Parser *)0x0;
  pDVar1->chkattrs = (CheckAttribs *)0x0;
  pDVar1->next = (Dict *)0x0;
  return pDVar1;
}

Assistant:

static Dict* NewDict( TidyDocImpl* doc, ctmbstr name )
{
    Dict *np = (Dict*) TidyDocAlloc( doc, sizeof(Dict) );
    np->id = TidyTag_UNKNOWN;
    np->name = name ? TY_(tmbstrdup)( doc->allocator, name ) : NULL;
    np->versions = VERS_UNKNOWN;
    np->attrvers = NULL;
    np->model = CM_UNKNOWN;
    np->parser = 0;
    np->chkattrs = 0;
    np->next = NULL;
    return np;
}